

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

DdNode * cuddUniqueInterZdd(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  DdNode **ppDVar1;
  int iVar2;
  uint uVar3;
  DdSubtable *pDVar4;
  DdSubtable *subtable;
  DdNode *looking;
  DdNodePtr *nodelist;
  int retval;
  uint level;
  int pos;
  DdNode *E_local;
  DdNode *T_local;
  int index_local;
  DdManager *unique_local;
  
  if ((index < unique->sizeZ) || (iVar2 = cuddResizeTableZdd(unique,index), iVar2 != 0)) {
    pDVar4 = unique->subtableZ + (uint)unique->permZ[index];
    if (pDVar4->maxKeys < pDVar4->keys) {
      if ((unique->gcEnabled == 0) ||
         ((unique->deadZ <= unique->minDead && (pDVar4->dead * 10 <= pDVar4->keys * 9)))) {
        ddRehashZdd(unique,unique->permZ[index]);
      }
      else {
        cuddGarbageCollect(unique,1);
      }
    }
    uVar3 = (((uint)(*(long *)(((ulong)T & 0xfffffffffffffffe) + 0x20) << 1) | (uint)T & 1) *
             0xc00005 +
            ((uint)(*(long *)(((ulong)E & 0xfffffffffffffffe) + 0x20) << 1) | (uint)E & 1)) *
            0x40f1f9 >> ((byte)pDVar4->shift & 0x1f);
    ppDVar1 = pDVar4->nodelist;
    for (subtable = (DdSubtable *)ppDVar1[(int)uVar3]; subtable != (DdSubtable *)0x0;
        subtable = *(DdSubtable **)&subtable->shift) {
      if ((*(DdNode **)&subtable->keys == T) && (*(DdNode **)&subtable->dead == E)) {
        if (*(int *)((long)&subtable->nodelist + 4) == 0) {
          cuddReclaimZdd(unique,(DdNode *)subtable);
        }
        return (DdNode *)subtable;
      }
    }
    if ((unique->autoDynZ == 0) ||
       (unique->keysZ - (unique->deadZ & unique->countDead) < unique->nextDyn)) {
      unique->keysZ = unique->keysZ + 1;
      pDVar4->keys = pDVar4->keys + 1;
      unique_local = (DdManager *)cuddAllocNode(unique);
      if (unique_local == (DdManager *)0x0) {
        unique_local = (DdManager *)0x0;
      }
      else {
        (unique_local->sentinel).index = index;
        (unique_local->sentinel).type.kids.T = T;
        (unique_local->sentinel).type.kids.E = E;
        (unique_local->sentinel).next = ppDVar1[(int)uVar3];
        ppDVar1[(int)uVar3] = (DdNode *)unique_local;
        *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
        *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
      }
    }
    else {
      iVar2 = Cudd_zddReduceHeap(unique,unique->autoMethodZ,10);
      if (iVar2 == 0) {
        unique->reordered = 2;
      }
      unique_local = (DdManager *)0x0;
    }
  }
  else {
    unique_local = (DdManager *)0x0;
  }
  return &unique_local->sentinel;
}

Assistant:

DdNode *
cuddUniqueInterZdd(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    int pos;
    unsigned int level;
    int retval;
    DdNodePtr *nodelist;
    DdNode *looking;
    DdSubtable *subtable;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (index >= unique->sizeZ) {
        if (!cuddResizeTableZdd(unique,index)) return(NULL);
    }

    level = unique->permZ[index];
    subtable = &(unique->subtableZ[level]);

#ifdef DD_DEBUG
    assert(level < (unsigned) cuddIZ(unique,T->index));
    assert(level < (unsigned) cuddIZ(unique,Cudd_Regular(E)->index));
#endif

    if (subtable->keys > subtable->maxKeys) {
        if (unique->gcEnabled && ((unique->deadZ > unique->minDead) ||
        (10 * subtable->dead > 9 * subtable->keys))) {  /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            ddRehashZdd(unique,(int)level);
        }
    }

    pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
    nodelist = subtable->nodelist;
    looking = nodelist[pos];

    while (looking != NULL) {
        if (cuddT(looking) == T && cuddE(looking) == E) {
            if (looking->ref == 0) {
                cuddReclaimZdd(unique,looking);
            }
            return(looking);
        }
        looking = looking->next;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }

    /* countDead is 0 if deads should be counted and ~0 if they should not. */
    if (unique->autoDynZ &&
    unique->keysZ - (unique->deadZ & unique->countDead) >= unique->nextDyn) {
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) return(NULL);
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) return(NULL);
#endif
        retval = Cudd_zddReduceHeap(unique,unique->autoMethodZ,10); /* 10 = whatever */
        if (retval == 0) unique->reordered = 2;
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) unique->reordered = 2;
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) unique->reordered = 2;
#endif
        return(NULL);
    }

    unique->keysZ++;
    subtable->keys++;

    looking = cuddAllocNode(unique);
    if (looking == NULL) return(NULL);
    looking->index = index;
    cuddT(looking) = T;
    cuddE(looking) = E;
    looking->next = nodelist[pos];
    nodelist[pos] = looking;
    cuddRef(T);
    cuddRef(E);

    return(looking);

}